

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::print(Board *this,string *messageToPrint)

{
  ostream *poVar1;
  int local_20;
  int local_1c;
  int j;
  int i;
  string *messageToPrint_local;
  Board *this_local;
  
  printSeperator();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)messageToPrint);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
      if (this->cells[local_1c][local_20] == 0) {
        std::operator<<((ostream *)&std::cout,". ");
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,(char)this->cells[local_1c][local_20] + '@');
        std::operator<<(poVar1," ");
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  printSeperator();
  return;
}

Assistant:

void Board::print(const string messageToPrint) {
    printSeperator();
    pp(messageToPrint);
    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            if (cells[i][j] == 0) {
                cout << ". ";
            } else {
                cout << static_cast<char>(cells[i][j] + 64) << " ";
            }
        }
        cout << endl;
    }
    printSeperator();
}